

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * __thiscall
google::protobuf::Reflection::GetRepeatedStringReference
          (Reflection *this,Message *message,FieldDescriptor *field,int index,string *scratch)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  FieldDescriptor *in_RDX;
  Message *in_RDI;
  Reflection *in_R8;
  char *in_stack_00000048;
  char *in_stack_00000050;
  undefined4 in_stack_00000058;
  CppType in_stack_0000005c;
  Descriptor *in_stack_00000060;
  FieldDescriptor *in_stack_00000068;
  Descriptor *in_stack_00000070;
  int in_stack_000000c8;
  int in_stack_000000cc;
  ExtensionSet *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Reflection *in_stack_ffffffffffffffc0;
  string *local_8;
  
  pDVar4 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar4 != (Descriptor *)(in_RDI->super_MessageLite)._vptr_MessageLite) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000060,(FieldDescriptor *)CONCAT44(in_stack_0000005c,in_stack_00000058),
               in_stack_00000050,in_stack_00000048);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000060,(FieldDescriptor *)CONCAT44(in_stack_0000005c,in_stack_00000058),
               in_stack_00000050,in_stack_00000048);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x424e23);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (in_stack_00000070,in_stack_00000068,(char *)in_stack_00000060,in_stack_0000005c);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    GetExtensionSet(in_stack_ffffffffffffffc0,
                    (Message *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    FieldDescriptor::number(in_RDX);
    local_8 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                        (in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  }
  else {
    FieldDescriptor::options(in_RDX);
    FieldOptions::ctype((FieldOptions *)0x424e9d);
    local_8 = GetRepeatedPtrField<std::__cxx11::string>
                        (in_R8,in_RDI,(FieldDescriptor *)in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffbc);
  }
  return local_8;
}

Assistant:

const std::string& Reflection::GetRepeatedStringReference(
    const Message& message, const FieldDescriptor* field, int index,
    std::string* scratch) const {
  USAGE_CHECK_ALL(GetRepeatedStringReference, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        return GetRepeatedPtrField<std::string>(message, field, index);
    }
  }
}